

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O0

void __thiscall de::cmdline::detail::Parser::OptInfo::OptInfo(OptInfo *this)

{
  OptInfo *this_local;
  
  this->shortName = (char *)0x0;
  this->longName = (char *)0x0;
  this->description = (char *)0x0;
  this->defaultValue = (char *)0x0;
  this->isFlag = false;
  this->parse = (GenericParseFunc)0x0;
  this->namedValues = (void *)0x0;
  this->namedValuesEnd = (void *)0x0;
  this->namedValueStride = 0;
  this->dispatchParse = (DispatchParseFunc)0x0;
  this->setDefault = (SetDefaultFunc)0x0;
  return;
}

Assistant:

OptInfo (void)
			: shortName			(DE_NULL)
			, longName			(DE_NULL)
			, description		(DE_NULL)
			, defaultValue		(DE_NULL)
			, isFlag			(false)
			, parse				(DE_NULL)
			, namedValues		(DE_NULL)
			, namedValuesEnd	(DE_NULL)
			, namedValueStride	(0)
			, dispatchParse		(DE_NULL)
			, setDefault		(DE_NULL)
		{}